

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trackable_ptr_extensions.cpp
# Opt level: O0

void test_trackable_base(void)

{
  reference pvVar1;
  I *pIVar2;
  __normal_iterator<I_*,_std::vector<I,_std::allocator<I>_>_> __a;
  iterator __x;
  __normal_iterator<I_*,_std::vector<I,_std::allocator<I>_>_> __b;
  int local_54;
  undefined1 local_50 [4];
  int i;
  trackable_ptr<I> p;
  int local_24;
  undefined1 local_20 [8];
  vector<I,_std::allocator<I>_> vec;
  
  std::vector<I,_std::allocator<I>_>::vector((vector<I,_std::allocator<I>_> *)local_20);
  local_24 = 1;
  std::vector<I,_std::allocator<I>_>::emplace_back<int>
            ((vector<I,_std::allocator<I>_> *)local_20,&local_24);
  pvVar1 = std::vector<I,_std::allocator<I>_>::front((vector<I,_std::allocator<I>_> *)local_20);
  tower120::trackable_ptr<I>::trackable_ptr((trackable_ptr<I> *)local_50,pvVar1);
  pIVar2 = tower120::trackable_ptr<I>::operator->((trackable_ptr<I> *)local_50);
  if (pIVar2->i != 1) {
    detail::require_failed
              ("p->i == 1",
               "/workspace/llm4binary/github/license_c_cmakelists/tower120[P]trackable_ptr/test/trackable_ptr_extensions.cpp"
               ,0x27);
  }
  for (local_54 = 2; local_54 < 1000; local_54 = local_54 + 1) {
    std::vector<test_trackable_base()::I,std::allocator<test_trackable_base()::I>>::
    emplace_back<int&>((vector<test_trackable_base()::I,std::allocator<test_trackable_base()::I>> *)
                       local_20,&local_54);
  }
  pIVar2 = tower120::trackable_ptr<I>::operator->((trackable_ptr<I> *)local_50);
  if (pIVar2->i != 1) {
    detail::require_failed
              ("p->i == 1",
               "/workspace/llm4binary/github/license_c_cmakelists/tower120[P]trackable_ptr/test/trackable_ptr_extensions.cpp"
               ,0x2c);
  }
  pIVar2 = tower120::trackable_ptr<I>::get((trackable_ptr<I> *)local_50);
  pvVar1 = std::vector<I,_std::allocator<I>_>::front((vector<I,_std::allocator<I>_> *)local_20);
  if (pIVar2 != pvVar1) {
    detail::require_failed
              ("p.get() == &vec.front()",
               "/workspace/llm4binary/github/license_c_cmakelists/tower120[P]trackable_ptr/test/trackable_ptr_extensions.cpp"
               ,0x2e);
  }
  __a = tower120::
        get_iterator<test_trackable_base()::I,std::vector<test_trackable_base()::I,std::allocator<test_trackable_base()::I>>&>
                  ((vector<I,_std::allocator<I>_> *)local_20,(trackable_ptr<I> *)local_50);
  __x = std::vector<I,_std::allocator<I>_>::end((vector<I,_std::allocator<I>_> *)local_20);
  __b = std::
        prev<__gnu_cxx::__normal_iterator<test_trackable_base()::I*,std::vector<test_trackable_base()::I,std::allocator<test_trackable_base()::I>>>>
                  (__x._M_current,1);
  std::
  iter_swap<__gnu_cxx::__normal_iterator<test_trackable_base()::I*,std::vector<test_trackable_base()::I,std::allocator<test_trackable_base()::I>>>,__gnu_cxx::__normal_iterator<test_trackable_base()::I*,std::vector<test_trackable_base()::I,std::allocator<test_trackable_base()::I>>>>
            (__a,__b);
  pIVar2 = tower120::trackable_ptr<I>::get((trackable_ptr<I> *)local_50);
  pvVar1 = std::vector<I,_std::allocator<I>_>::back((vector<I,_std::allocator<I>_> *)local_20);
  if (pIVar2 != pvVar1) {
    detail::require_failed
              ("p.get() == &vec.back()",
               "/workspace/llm4binary/github/license_c_cmakelists/tower120[P]trackable_ptr/test/trackable_ptr_extensions.cpp"
               ,0x30);
  }
  pIVar2 = tower120::trackable_ptr<I>::operator->((trackable_ptr<I> *)local_50);
  if (pIVar2->i != 1) {
    detail::require_failed
              ("p->i == 1",
               "/workspace/llm4binary/github/license_c_cmakelists/tower120[P]trackable_ptr/test/trackable_ptr_extensions.cpp"
               ,0x31);
  }
  tower120::trackable_ptr<I>::~trackable_ptr((trackable_ptr<I> *)local_50);
  std::vector<I,_std::allocator<I>_>::~vector((vector<I,_std::allocator<I>_> *)local_20);
  return;
}

Assistant:

void test_trackable_base(){
    struct I : trackable_base {
        int i;
        I(int i) : i(i) {}
    };

    std::vector<I> vec;
    vec.emplace_back(1);
    trackable_ptr<I> p{&vec.front()};
    REQUIRE(p->i == 1);

    for(int i=2;i<1000;++i){
        vec.emplace_back(i);
    }
    REQUIRE(p->i == 1);

    REQUIRE(p.get() == &vec.front());
    std::iter_swap(get_iterator(vec, p), std::prev(vec.end()));
    REQUIRE(p.get() == &vec.back());
    REQUIRE(p->i == 1);
}